

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallMap.h
# Opt level: O0

char * __thiscall
slang::detail::hashing::StackAllocStorage<704ul,16ul>::allocate<8ul>
          (StackAllocStorage<704UL,_16UL> *this,size_t n)

{
  size_t sVar1;
  size_t in_RSI;
  long in_RDI;
  char *r;
  size_t aligned_n;
  undefined8 local_8;
  
  sVar1 = StackAllocStorage<704UL,_16UL>::alignUp(in_RSI);
  if ((ulong)((in_RDI + 0x2c0) - *(long *)(in_RDI + 0x2c0)) < sVar1) {
    local_8 = (char *)operator_new(0x4f8f42);
  }
  else {
    local_8 = *(char **)(in_RDI + 0x2c0);
    *(size_t *)(in_RDI + 0x2c0) = sVar1 + *(long *)(in_RDI + 0x2c0);
  }
  return local_8;
}

Assistant:

char* allocate(size_t n) {
        static_assert(ReqAlign <= Align, "alignment is too small for this arena");

        SLANG_ASSERT(isInBuffer(ptr));
        auto aligned_n = alignUp(n);
        if (static_cast<decltype(aligned_n)>(buffer + N - ptr) >= aligned_n) {
            char* r = ptr;
            ptr += aligned_n;
            return r;
        }

        static_assert(Align <= alignof(std::max_align_t),
                      "you've chosen an alignment that is larger than alignof(std::max_align_t), "
                      "and cannot be guaranteed by normal operator new");
        return static_cast<char*>(::operator new(n));
    }